

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::(anonymous_namespace)::FlatHashMap_StandardLayout_Test::TestBody()::Int,phmap::priv::(anonymous_namespace)::FlatHashMap_StandardLayout_Test::TestBody()::Int>,phmap::priv::(anonymous_namespace)::FlatHashMap_StandardLayout_Test::TestBody()::Hash,phmap::EqualTo<phmap::priv::(anonymous_namespace)::FlatHashMap_StandardLayout_Test::TestBody()::Int>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::FlatHashMap_StandardLayout_Test::TestBody()::Int_const,phmap::priv::(anonymous_namespace)::FlatHashMap_StandardLayout_Test::TestBody()::Int>>>
::
emplace_at<std::piecewise_construct_t_const&,std::tuple<phmap::priv::(anonymous_namespace)::FlatHashMap_StandardLayout_Test::TestBody()::Int&&>,std::tuple<phmap::priv::(anonymous_namespace)::FlatHashMap_StandardLayout_Test::TestBody()::Int&&>>
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::(anonymous_namespace)::FlatHashMap_StandardLayout_Test::TestBody()::Int,phmap::priv::(anonymous_namespace)::FlatHashMap_StandardLayout_Test::TestBody()::Int>,phmap::priv::(anonymous_namespace)::FlatHashMap_StandardLayout_Test::TestBody()::Hash,phmap::EqualTo<phmap::priv::(anonymous_namespace)::FlatHashMap_StandardLayout_Test::TestBody()::Int>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::FlatHashMap_StandardLayout_Test::TestBody()::Int_const,phmap::priv::(anonymous_namespace)::FlatHashMap_StandardLayout_Test::TestBody()::Int>>>
           *this,size_t i,piecewise_construct_t *args,tuple<Int_&&> *args_1,tuple<Int_&&> *args_2)

{
  allocator_type *alloc;
  tuple<Int_&&> *args_local_2;
  tuple<Int_&&> *args_local_1;
  piecewise_construct_t *args_local;
  size_t i_local;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
  *this_local;
  
  alloc = raw_hash_set<phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
          ::alloc_ref((raw_hash_set<phmap::priv::FlatHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
                       *)this);
  hash_policy_traits<phmap::priv::FlatHashMapPolicy<phmap::priv::(anonymous_namespace)::FlatHashMap_StandardLayout_Test::TestBody()::Int,phmap::priv::(anonymous_namespace)::FlatHashMap_StandardLayout_Test::TestBody()::Int>,void>
  ::
  construct<std::allocator<std::pair<phmap::priv::(anonymous_namespace)::FlatHashMap_StandardLayout_Test::TestBody()::Int_const,phmap::priv::(anonymous_namespace)::FlatHashMap_StandardLayout_Test::TestBody()::Int>>,std::piecewise_construct_t_const&,std::tuple<phmap::priv::(anonymous_namespace)::FlatHashMap_StandardLayout_Test::TestBody()::Int&&>,std::tuple<phmap::priv::(anonymous_namespace)::FlatHashMap_StandardLayout_Test::TestBody()::Int&&>>
            (alloc,(slot_type *)(*(long *)(this + 8) + i * 0x10),args,args_1,args_2);
  return;
}

Assistant:

void emplace_at(size_t i, Args&&... args) {
        PolicyTraits::construct(&alloc_ref(), slots_ + i,
                                std::forward<Args>(args)...);
        
#ifdef PHMAP_CHECK_CONSTRUCTED_VALUE
        // this check can be costly, so do it only when requested
        assert(PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) ==
               iterator_at(i) &&
               "constructed value does not match the lookup key");
#endif
    }